

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# versionbits.cpp
# Opt level: O3

int32_t __thiscall
VersionBitsCache::ComputeBlockVersion(VersionBitsCache *this,CBlockIndex *pindexPrev,Params *params)

{
  bool bVar1;
  ThresholdState TVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock3;
  AbstractThresholdConditionChecker local_58;
  undefined2 local_50;
  unique_lock<std::mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_owns = false;
  local_48._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_48);
  uVar3 = 0x20000000;
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar5 = bVar1;
    local_58._vptr_AbstractThresholdConditionChecker = (_func_int **)&PTR_Condition_013945b8;
    local_50 = (undefined2)lVar4;
    TVar2 = AbstractThresholdConditionChecker::GetStateFor
                      (&local_58,pindexPrev,params,this->m_caches + lVar4);
    if (TVar2 - STARTED < 2) {
      uVar3 = uVar3 | 1 << ((byte)params->vDeployments[lVar4].bit & 0x1f);
    }
    lVar4 = 1;
    bVar1 = false;
  } while (bVar5);
  std::unique_lock<std::mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

int32_t VersionBitsCache::ComputeBlockVersion(const CBlockIndex* pindexPrev, const Consensus::Params& params)
{
    LOCK(m_mutex);
    int32_t nVersion = VERSIONBITS_TOP_BITS;

    for (int i = 0; i < (int)Consensus::MAX_VERSION_BITS_DEPLOYMENTS; i++) {
        Consensus::DeploymentPos pos = static_cast<Consensus::DeploymentPos>(i);
        ThresholdState state = VersionBitsConditionChecker(pos).GetStateFor(pindexPrev, params, m_caches[pos]);
        if (state == ThresholdState::LOCKED_IN || state == ThresholdState::STARTED) {
            nVersion |= Mask(params, pos);
        }
    }

    return nVersion;
}